

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O1

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>::
ContIntToDescriptor(ChContactNSC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<6>_>
                    *this,uint off_L,ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  long lVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = (ulong)off_L;
  lVar1 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar3 < lVar1) {
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    (this->Nx).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
    .super_ChConstraint.l_i = pdVar2[uVar3];
    uVar4 = (ulong)(off_L + 1);
    if ((long)uVar4 < lVar1) {
      (this->Tu).
      super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
      .super_ChConstraint.l_i = pdVar2[uVar4];
      uVar5 = (ulong)(off_L + 2);
      if ((long)uVar5 < lVar1) {
        (this->Tv).
        super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
        .super_ChConstraint.l_i = pdVar2[uVar5];
        lVar1 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows;
        if ((long)uVar3 < lVar1) {
          pdVar2 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          (this->Nx).
          super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
          .super_ChConstraint.b_i = pdVar2[uVar3];
          if (((long)uVar4 < lVar1) &&
             ((this->Tu).
              super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
              .super_ChConstraint.b_i = pdVar2[uVar4], (long)uVar5 < lVar1)) {
            (this->Tv).
            super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_3vars<6,_6,_6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
            .super_ChConstraint.b_i = pdVar2[uVar5];
            return;
          }
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

virtual void ContIntToDescriptor(const unsigned int off_L,
                                     const ChVectorDynamic<>& L,
                                     const ChVectorDynamic<>& Qc
                                     ) override {
        // only for solver warm start
        Nx.Set_l_i(L(off_L));
        Tu.Set_l_i(L(off_L + 1));
        Tv.Set_l_i(L(off_L + 2));

        // solver known terms
        Nx.Set_b_i(Qc(off_L));
        Tu.Set_b_i(Qc(off_L + 1));
        Tv.Set_b_i(Qc(off_L + 2));
    }